

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_modifiers.cpp
# Opt level: O3

ON_XMLNode * __thiscall ON_Displacement::AddChildXML(ON_Displacement *this,ON_XMLRootNode *root)

{
  CImplDSP *pCVar1;
  SubItem *pSVar2;
  int iVar3;
  CImpl *in_RAX;
  ON_XMLNode *pOVar4;
  ON_XMLNode *pOVar5;
  undefined4 extraout_var;
  SubItemIterator it;
  SubItemIterator local_28;
  
  local_28.m_impl = in_RAX;
  pOVar4 = ON_MeshModifier::AddChildXML(&this->super_ON_MeshModifier,root);
  if (pOVar4 != (ON_XMLNode *)0x0) {
    SubItemIterator::SubItemIterator(&local_28,this);
    while( true ) {
      iVar3 = (local_28.m_impl)->m_index;
      pCVar1 = (local_28.m_impl)->m_dsp->m_impl_dsp;
      if ((pCVar1->m_subs).m_count <= iVar3) break;
      (local_28.m_impl)->m_index = iVar3 + 1;
      pSVar2 = (pCVar1->m_subs).m_a[iVar3];
      if (pSVar2 == (SubItem *)0x0) break;
      pOVar5 = (ON_XMLNode *)operator_new(0xe8);
      ON_XMLNode::ON_XMLNode(pOVar5,L"");
      iVar3 = (*pOVar4->_vptr_ON_XMLNode[0xb])(pOVar4,pOVar5);
      pOVar5 = ON_InternalXMLImpl::Node(&pSVar2->m_impl->super_ON_InternalXMLImpl);
      ON_XMLNode::operator=((ON_XMLNode *)CONCAT44(extraout_var,iVar3),pOVar5);
    }
    SubItemIterator::~SubItemIterator(&local_28);
  }
  return pOVar4;
}

Assistant:

ON_XMLNode* ON_Displacement::AddChildXML(ON_XMLRootNode& root) const
{
  ON_XMLNode* dsp_node = ON_MeshModifier::AddChildXML(root);
  if (nullptr != dsp_node)
  {
    auto it = GetSubItemIterator();
    SubItem* sub_item = nullptr;
    while (nullptr != (sub_item = it.Next()))
    {
      ON_XMLNode* sub_node = dsp_node->AttachChildNode(new ON_XMLNode(L""));
      sub_item->ToXML(*sub_node);
    }
  }

  return dsp_node;
}